

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,FunctionStatement *func_stmt,void *data)

{
  int start_register;
  pointer pSVar1;
  CodeGenerateVisitor *in_RDI;
  FunctionNameData_conflict name_data;
  ExpVarData_conflict exp_var_data;
  int func_register;
  Guard g;
  int r;
  anon_class_16_2_fd512ddf *__f;
  function<void_()> *in_stack_ffffffffffffff40;
  function<void_()> *this_00;
  function<void_()> *in_stack_ffffffffffffff48;
  Guard *in_stack_ffffffffffffff50;
  CodeGenerateVisitor *in_stack_ffffffffffffff60;
  function<void_()> local_88;
  anon_class_16_2_fd512ddf local_60 [4];
  int local_1c;
  
  local_1c = GetNextRegisterId(in_RDI);
  __f = local_60;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::FunctionStatement*,void*)::__0,void>
            (in_stack_ffffffffffffff40,(anon_class_1_0_00000001 *)__f);
  this_00 = &local_88;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::FunctionStatement*,void*)::__1,void>(this_00,__f);
  Guard::Guard(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,this_00);
  std::function<void_()>::~function((function<void_()> *)0x1a1038);
  std::function<void_()>::~function((function<void_()> *)0x1a1042);
  start_register = GenerateRegisterId(in_stack_ffffffffffffff60);
  ExpVarData::ExpVarData((ExpVarData *)&stack0xffffffffffffff50,start_register,start_register + 1);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1a107f);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&stack0xffffffffffffff50);
  FunctionNameData::FunctionNameData((FunctionNameData *)&stack0xffffffffffffff4c,start_register);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1a10b8);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&stack0xffffffffffffff4c);
  Guard::~Guard((Guard *)in_RDI);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(FunctionStatement *func_stmt, void *data)
    {
        REGISTER_GENERATOR_GUARD();
        auto func_register = GenerateRegisterId();
        ExpVarData exp_var_data{ func_register, func_register + 1 };
        func_stmt->func_body_->Accept(this, &exp_var_data);

        FunctionNameData name_data{ func_register };
        func_stmt->func_name_->Accept(this, &name_data);
    }